

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::printContinue(JSPrinter *this,Ref node)

{
  char cVar1;
  Ref *this_00;
  undefined8 *puVar2;
  char *s;
  Value *local_20;
  Ref node_local;
  
  local_20 = node.inst;
  emit(this,"continue");
  this_00 = (Ref *)cashew::Ref::operator[]((uint)&local_20);
  cVar1 = cashew::Ref::operator!(this_00);
  if (cVar1 == '\0') {
    emit(this,' ');
    puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
    s = Value::getCString((Value *)*puVar2);
    emit(this,s);
  }
  return;
}

Assistant:

void printContinue(Ref node) {
    emit("continue");
    if (!!node[1]) {
      emit(' ');
      emit(node[1]->getCString());
    }
  }